

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O3

void __thiscall Dijkstra::run(Dijkstra *this)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  bool bVar4;
  _Bvector_impl *p_Var5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  pointer ptVar10;
  ostream *poVar11;
  pointer piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *this_00;
  tuple initial;
  allocator_type local_d1;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  pointer piStack_a0;
  _Bit_type *local_98;
  uint uStack_90;
  undefined4 uStack_8c;
  _Bit_pointer local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *local_68;
  long local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  ptVar10 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
            _M_impl.super__Vector_impl_data._M_start;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ptVar10 != (pointer)0x0) {
    operator_delete(ptVar10);
  }
  local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->nb_nodes,(bool *)local_a8,(allocator_type *)&local_d0);
  local_d0 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_d0,&local_d1);
  piVar12 = (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_a0;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_98;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  piStack_a0 = (pointer)0x0;
  local_98 = (_Bit_type *)0x0;
  if ((piVar12 != (pointer)0x0) &&
     (operator_delete(piVar12), (value_type)local_a8 != (value_type)0x0)) {
    operator_delete((void *)local_a8);
  }
  local_d0 = local_d0 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_a8,(long)this->nb_nodes,(bool *)&local_d0,
             (allocator_type *)&local_d1);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->has_kids).super__Bvector_base<std::allocator<bool>_>);
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_88;
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = local_98;
  p_Var5 = &(this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset = uStack_90;
  *(undefined4 *)&(p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       uStack_8c;
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)local_a8;
  *(pointer *)
   &(this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = piStack_a0;
  local_d0 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_d0,&local_d1);
  piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_a0;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_98;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  piStack_a0 = (pointer)0x0;
  local_98 = (_Bit_type *)0x0;
  if ((piVar12 != (pointer)0x0) &&
     (operator_delete(piVar12), (value_type)local_a8 != (value_type)0x0)) {
    operator_delete((void *)local_a8);
  }
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[this->source] = this->source;
  iVar6 = (*this->_vptr_Dijkstra[9])(this);
  this_00 = &this->q;
  piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar12[this->source] = iVar6;
  local_a8._4_4_ = piVar12[this->source];
  local_a8._0_4_ = this->source;
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::push(this_00,(value_type *)local_a8);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"START",5);
    local_d0 = CONCAT31(local_d0._1_3_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_d0,1);
  }
  ptVar10 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ptVar10 !=
       (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
       super__Vector_impl_data._M_finish) && (0 < this->nb_nodes)) {
    local_b8 = 0;
    local_70 = 0x800000000000003f;
    local_68 = this_00;
    do {
      uVar2 = ptVar10->node;
      std::
      priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
      ::pop(this_00);
      uVar13 = (ulong)(int)uVar2;
      uVar7 = uVar2 + 0x3f;
      if (-1 < (int)uVar2) {
        uVar7 = uVar2;
      }
      uVar14 = (ulong)((uVar13 & local_70) < 0x8000000000000001);
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(long)((int)uVar7 >> 6) + (uVar14 - 1)] >>
           (uVar13 & 0x3f) & 1) == 0) {
        local_cc = uVar2;
        local_c8 = uVar13;
        local_80 = 1L << ((byte)uVar2 & 0x3f);
        local_78 = (long)((int)uVar7 >> 6) * 8;
        (*this->_vptr_Dijkstra[3])(this,(ulong)uVar2);
        local_60 = uVar14 * 8 + -8;
        puVar1 = (ulong *)((long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          local_60 + local_78);
        *puVar1 = *puVar1 | local_80;
        if (this->verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Visiting ",9);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_cc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," from ",6);
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar11,
                               (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_c8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(cost: ",7);
          poVar11 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar11,
                               (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_c8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
          local_d0 = CONCAT31(local_d0._1_3_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_d0,1);
        }
        uVar13 = local_c8;
        local_b8 = (ulong)((int)local_b8 + 1);
        pvVar3 = (this->out).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar12 = pvVar3[local_c8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pvVar3[local_c8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar12) {
          uVar14 = 0;
          uVar15 = 1;
          do {
            uVar2 = piVar12[uVar14];
            iVar6 = (*this->_vptr_Dijkstra[4])(this,(ulong)uVar2);
            if (((char)iVar6 == '\0') &&
               (iVar6 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,0xffffffff), -1 < iVar6)) {
              uVar7 = *(uint *)(*(long *)&(this->en).
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 4);
              iVar6 = (*this->_vptr_Dijkstra[6])(this,(ulong)uVar7);
              if ((char)iVar6 == '\0') {
                uVar14 = (ulong)(int)uVar7;
                uVar8 = uVar7 + 0x3f;
                if (-1 < (int)uVar7) {
                  uVar8 = uVar7;
                }
                if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)((int)uVar8 >> 6) +
                      ((ulong)((uVar14 & local_70) < 0x8000000000000001) - 1)] >> (uVar14 & 0x3f) &
                    1) == 0) {
                  piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  local_c0 = uVar14;
                  if (piVar12[uVar14] != -1) {
                    local_b0 = piVar12[local_c8];
                    local_ac = piVar12[uVar14];
                    iVar6 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2);
                    iVar9 = (*this->_vptr_Dijkstra[9])(this,(ulong)uVar7);
                    if (local_ac <= iVar6 + local_b0 + iVar9) goto LAB_001c4379;
                    piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  }
                  uVar8 = piVar12[local_c8];
                  iVar6 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,(ulong)uVar8);
                  iVar9 = (*this->_vptr_Dijkstra[9])(this,(ulong)uVar7);
                  piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar12[local_c0] = iVar6 + uVar8 + iVar9;
                  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_c0] = local_cc;
                  puVar1 = (ulong *)((long)(this->has_kids).
                                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p + local_60 + local_78);
                  *puVar1 = *puVar1 | local_80;
                  if (this->verbose == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Marked ",7);
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," from ",6);
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,local_cc);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," of cost ",9);
                    poVar11 = (ostream *)
                              std::ostream::operator<<
                                        ((ostream *)poVar11,
                                         (this->cost).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[local_c0]);
                    local_d0 = CONCAT31(local_d0._1_3_,10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_d0,1);
                    piVar12 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  }
                  (*this->_vptr_Dijkstra[7])(this,CONCAT44(piVar12[local_c0],uVar7));
                }
              }
            }
            else {
              if (this->verbose == true) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Ignoring edge ",0xe);
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," from ",6);
                poVar11 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)poVar11,
                                     *(this->en).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
                poVar11 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)poVar11,
                                     *(int *)(*(long *)&(this->en).
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
                local_d0 = CONCAT31(local_d0._1_3_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_d0,1);
              }
              (*this->_vptr_Dijkstra[5])(this,(ulong)uVar2);
            }
LAB_001c4379:
            pvVar3 = (this->out).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar12 = pvVar3[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            bVar4 = uVar15 < (ulong)((long)pvVar3[uVar13].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)piVar12 >> 2);
            uVar14 = uVar15;
            this_00 = local_68;
            uVar15 = (ulong)((int)uVar15 + 1);
          } while (bVar4);
        }
      }
      ptVar10 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while ((ptVar10 !=
              (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
              _M_impl.super__Vector_impl_data._M_finish) && ((int)local_b8 < this->nb_nodes));
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Dijkstra::run() {
	q = std::priority_queue<tuple, std::vector<tuple>, Dijkstra::Priority>();
	std::vector<bool> vis = std::vector<bool>(nb_nodes, false);

	int count = 0;

	pred = std::vector<int>(nb_nodes, -1);
	has_kids = std::vector<bool>(nb_nodes, false);
	cost = std::vector<int>(nb_nodes, -1);

	pred[source] = source;
	cost[source] = duration(source);
	const tuple initial(source, cost[source]);
	q.push(initial);

	if (verbose) {
		std::cout << "START" << '\n';
	}

	while (!q.empty() && count < nb_nodes) {
		const tuple top = q.top();
		q.pop();
		const int curr = top.node;

		if (vis[curr]) {
			continue;
		}

		on_visiting_node(curr);
		vis[curr] = true;
		count++;

		if (verbose) {
			std::cout << "Visiting " << curr << " from " << pred[curr] << "(cost: " << cost[curr] << ")"
								<< '\n';
		}

		for (unsigned int i = 0; i < out[curr].size(); i++) {
			const int e = out[curr][i];
			assert(en[e][0] == curr);
			if (ignore_edge(e) || weight(e) < 0) {
				if (verbose) {
					std::cout << "Ignoring edge " << e << " from " << en[e][0] << " to " << en[e][1] << '\n';
				}
				on_ignore_edge(e);
				continue;
			}
			const int other = en[e][1];  // Head of e

			if (ignore_node(other)) {
				continue;
			}
			if (vis[other]) {
				continue;
			}

			if (cost[other] == -1 || cost[other] > cost[curr] + weight(e, cost[curr]) + duration(other)) {
				cost[other] = cost[curr] + weight(e, cost[curr]) + duration(other);
				assert(cost[other] != -1);
				pred[other] = curr;
				has_kids[curr] = true;
				if (verbose) {
					std::cout << "Marked " << other << " from " << curr << " of cost " << cost[other] << '\n';
				}
				const tuple new_node(other, cost[other]);
				enqueue(new_node);
			}
		}
	}
}